

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMem.c
# Opt level: O1

void Hop_ManAddMemory(Hop_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  undefined8 *puVar3;
  int iVar4;
  void *pvVar5;
  void **ppvVar6;
  undefined8 *puVar7;
  Hop_Obj_t *pHVar8;
  
  if (p->pListFree != (Hop_Obj_t *)0x0) {
    __assert_fail("p->pListFree == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopMem.c"
                  ,0x5e,"void Hop_ManAddMemory(Hop_Man_t *)");
  }
  pvVar5 = malloc(0x28040);
  pVVar2 = p->vChunks;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar6;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_00763fbd;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar6;
    }
    pVVar2->nCap = iVar4;
  }
LAB_00763fbd:
  iVar4 = pVVar2->nSize;
  pVVar2->nSize = iVar4 + 1;
  pVVar2->pArray[iVar4] = pvVar5;
  pHVar8 = (Hop_Obj_t *)(((ulong)pvVar5 & 0xffffffffffffffc0) + 0x40);
  pVVar2 = p->vPages;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar6;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_00764052;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar6;
    }
    pVVar2->nCap = iVar4;
  }
LAB_00764052:
  iVar4 = pVVar2->nSize;
  pVVar2->nSize = iVar4 + 1;
  pVVar2->pArray[iVar4] = pHVar8;
  p->pListFree = pHVar8;
  iVar4 = 0xfff;
  puVar3 = (undefined8 *)((long)pvVar5 + (0x68 - (ulong)((uint)pvVar5 & 0x3f)));
  do {
    puVar7 = puVar3;
    puVar7[-5] = puVar7;
    iVar4 = iVar4 + -1;
    puVar3 = puVar7 + 5;
  } while (iVar4 != 0);
  *puVar7 = 0;
  return;
}

Assistant:

void Hop_ManAddMemory( Hop_Man_t * p )
{
    char * pMemory;
    int i, nBytes;
    assert( sizeof(Hop_Obj_t) <= 64 );
    assert( p->pListFree == NULL );
//    assert( (Hop_ManObjNum(p) & IVY_PAGE_MASK) == 0 );
    // allocate new memory page
    nBytes = sizeof(Hop_Obj_t) * (1<<IVY_PAGE_SIZE) + 64;
    pMemory = ABC_ALLOC( char, nBytes );
    Vec_PtrPush( p->vChunks, pMemory );
    // align memory at the 32-byte boundary
    pMemory = pMemory + 64 - (((int)(ABC_PTRUINT_T)pMemory) & 63);
    // remember the manager in the first entry
    Vec_PtrPush( p->vPages, pMemory );
    // break the memory down into nodes
    p->pListFree = (Hop_Obj_t *)pMemory;
    for ( i = 1; i <= IVY_PAGE_MASK; i++ )
    {
        *((char **)pMemory) = pMemory + sizeof(Hop_Obj_t);
        pMemory += sizeof(Hop_Obj_t);
    }
    *((char **)pMemory) = NULL;
}